

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall caffe::EltwiseParameter::Clear(EltwiseParameter *this)

{
  (this->coeff_).current_size_ = 0;
  if (((this->_has_bits_).has_bits_[0] & 3) != 0) {
    this->operation_ = 1;
    this->stable_prod_grad_ = true;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

inline void RepeatedField<Element>::Clear() {
  current_size_ = 0;
}